

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O3

string * __thiscall
svg::Polygon::toString_abi_cxx11_(string *__return_storage_ptr__,Polygon *this,Layout *layout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string *psVar3;
  long *plVar4;
  pointer pPVar5;
  ostream *poVar6;
  size_type *psVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  stringstream ss;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"polygon","");
  std::operator+(&local_1e0,"\t<",&local_200);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_220.field_2._M_allocated_capacity = *psVar7;
    local_220.field_2._8_8_ = plVar4[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar7;
    local_220._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_220._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"points=\"",8);
  pPVar5 = (this->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1c0 = __return_storage_ptr__;
  if ((this->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar5) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      if ((layout->origin & ~BottomLeft) == TopRight) {
        dVar10 = (layout->dimensions).width -
                 (pPVar5[uVar8].x + (layout->origin_offset).x) * layout->scale;
      }
      else {
        dVar10 = (pPVar5[uVar8].x + (layout->origin_offset).x) * layout->scale;
      }
      poVar6 = std::ostream::_M_insert<double>(dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
      dVar10 = (this->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8].y;
      if ((layout->origin | TopRight) == BottomRight) {
        dVar10 = (layout->dimensions).height - (dVar10 + (layout->origin_offset).y) * layout->scale;
      }
      else {
        dVar10 = (dVar10 + (layout->origin_offset).y) * layout->scale;
      }
      poVar6 = std::ostream::_M_insert<double>(dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pPVar5 = (this->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar2 = uVar9 < (ulong)((long)(this->points).
                                    super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 4);
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\" ",2);
  psVar3 = local_1c0;
  Fill::toString_abi_cxx11_(&local_1e0,&(this->super_Shape).fill,layout);
  paVar1 = &local_200.field_2;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  Stroke::toString_abi_cxx11_(&local_220,&(this->super_Shape).stroke,layout);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_220._M_dataplus._M_p,local_220._M_string_length);
  local_200.field_2._M_allocated_capacity._0_4_ = 0xa3e2f;
  local_200._M_string_length = 3;
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,paVar1->_M_local_buf,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("polygon");

            ss << "points=\"";
            for (unsigned i = 0; i < points.size(); ++i)
                ss << translateX(points[i].x, layout) << "," << translateY(points[i].y, layout) << " ";
            ss << "\" ";

            ss << fill.toString(layout) << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }